

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sorter.cpp
# Opt level: O2

void __thiscall duckdb::MergeSorter::ComputeMerge(MergeSorter *this,idx_t *count,bool *left_smaller)

{
  SortedBlock *this_00;
  SortedBlock *this_01;
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  uint uVar3;
  type pSVar4;
  type pSVar5;
  ulong uVar6;
  reference pvVar7;
  pointer pRVar8;
  pointer pSVar9;
  data_ptr_t str1;
  data_ptr_t str2;
  type pSVar10;
  type left;
  type right;
  idx_t iVar11;
  SortLayout *pSVar12;
  unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true> *this_02;
  ulong uVar13;
  idx_t iVar14;
  unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true> *this_03;
  idx_t iVar15;
  ulong uVar16;
  data_ptr_t local_a0;
  data_ptr_t local_98;
  bool *local_90;
  ulong *local_88;
  ulong local_80;
  idx_t local_78;
  ulong local_70;
  idx_t local_68;
  unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true> *local_60;
  unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true> *local_58;
  SortedBlock *local_50;
  idx_t local_48;
  idx_t iStack_40;
  
  this_03 = &this->left;
  local_90 = left_smaller;
  pSVar4 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
           operator*(this_03);
  this_02 = &this->right;
  pSVar5 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
           operator*(this_02);
  this_00 = pSVar4->sb;
  local_68 = pSVar4->block_idx;
  local_50 = pSVar5->sb;
  uVar13 = pSVar4->entry_idx;
  local_48 = pSVar5->block_idx;
  iStack_40 = pSVar5->entry_idx;
  local_58 = &this_00->blob_sorting_data;
  local_60 = &local_50->blob_sorting_data;
  uVar6 = *count;
  uVar16 = 0;
  pdVar1 = local_a0;
  pdVar2 = local_98;
  local_88 = count;
  local_70 = uVar13;
  while (local_98 = pdVar2, local_a0 = pdVar1, this_01 = local_50, uVar16 < uVar6) {
    if (pSVar4->block_idx <
        (ulong)((long)(this_00->radix_sorting_data).
                      super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this_00->radix_sorting_data).
                      super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3)) {
      pvVar7 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
               ::get<true>(&this_00->radix_sorting_data,pSVar4->block_idx);
      pRVar8 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
               operator->(pvVar7);
      if (uVar13 == pRVar8->count) {
        pSVar4->block_idx = pSVar4->block_idx + 1;
        pSVar4->entry_idx = 0;
      }
    }
    uVar13 = pSVar5->block_idx;
    if (uVar13 < (ulong)((long)(this_01->radix_sorting_data).
                               super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this_01->radix_sorting_data).
                               super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3)) {
      iVar11 = pSVar5->entry_idx;
      pvVar7 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
               ::get<true>(&this_01->radix_sorting_data,uVar13);
      pRVar8 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
               operator->(pvVar7);
      uVar13 = pSVar5->block_idx;
      if (iVar11 == pRVar8->count) {
        uVar13 = uVar13 + 1;
        pSVar5->block_idx = uVar13;
        pSVar5->entry_idx = 0;
      }
    }
    if ((pSVar4->block_idx ==
         (long)(this_00->radix_sorting_data).
               super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this_00->radix_sorting_data).
               super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3) ||
       (uVar13 == (long)(this_01->radix_sorting_data).
                        super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this_01->radix_sorting_data).
                        super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3)) break;
    pSVar9 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
             operator->(this_03);
    SBScanState::PinRadix(pSVar9,pSVar4->block_idx);
    pSVar9 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
             operator->(this_03);
    str1 = SBScanState::RadixPtr(pSVar9);
    local_98 = str1;
    pSVar9 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
             operator->(this_02);
    SBScanState::PinRadix(pSVar9,pSVar5->block_idx);
    pSVar9 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
             operator->(this_02);
    str2 = SBScanState::RadixPtr(pSVar9);
    local_a0 = str2;
    pvVar7 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
             ::get<true>(&this_00->radix_sorting_data,pSVar4->block_idx);
    pRVar8 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
             operator->(pvVar7);
    local_78 = pRVar8->count;
    pvVar7 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
             ::get<true>(&this_01->radix_sorting_data,pSVar5->block_idx);
    pRVar8 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
             operator->(pvVar7);
    local_80 = pRVar8->count;
    pSVar12 = this->sort_layout;
    if (pSVar12->all_constant == true) {
      iVar11 = pSVar5->entry_idx;
      while( true ) {
        uVar6 = *local_88;
        uVar13 = pSVar4->entry_idx;
        pdVar1 = str2;
        pdVar2 = str1;
        if (((uVar6 <= uVar16) || (local_78 <= uVar13)) || (local_80 <= iVar11)) break;
        uVar3 = FastMemcmp(str1,str2,pSVar12->comparison_size);
        local_90[uVar16] = SUB41(uVar3 >> 0x1f,0);
        pSVar4->entry_idx = pSVar4->entry_idx + (ulong)(uVar3 >> 0x1f);
        iVar11 = (ulong)(-1 < (int)uVar3) + pSVar5->entry_idx;
        pSVar5->entry_idx = iVar11;
        pSVar12 = this->sort_layout;
        iVar15 = 0;
        if (-1 < (int)uVar3) {
          iVar15 = pSVar12->entry_size;
        }
        str1 = str1 + pSVar12->entry_size * (ulong)(uVar3 >> 0x1f);
        str2 = str2 + iVar15;
        uVar16 = uVar16 + 1;
      }
    }
    else {
      pSVar9 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
               operator->(this_03);
      pSVar10 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
                operator*(local_58);
      SBScanState::PinData(pSVar9,pSVar10);
      pSVar9 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
               operator->(this_02);
      pSVar10 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
                operator*(local_60);
      SBScanState::PinData(pSVar9,pSVar10);
      iVar11 = pSVar5->entry_idx;
      while( true ) {
        uVar6 = *local_88;
        uVar13 = pSVar4->entry_idx;
        pdVar1 = local_a0;
        pdVar2 = local_98;
        if (((uVar6 <= uVar16) || (local_78 <= uVar13)) || (local_80 <= iVar11)) break;
        left = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
               operator*(this_03);
        right = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
                operator*(this_02);
        uVar3 = Comparators::CompareTuple
                          (left,right,&local_98,&local_a0,this->sort_layout,&this->state->external);
        local_90[uVar16] = SUB41(uVar3 >> 0x1f,0);
        pSVar4->entry_idx = pSVar4->entry_idx + (ulong)(uVar3 >> 0x1f);
        iVar11 = (ulong)(-1 < (int)uVar3) + pSVar5->entry_idx;
        pSVar5->entry_idx = iVar11;
        iVar15 = this->sort_layout->entry_size;
        iVar14 = 0;
        if (-1 < (int)uVar3) {
          iVar14 = iVar15;
        }
        str1 = str1 + iVar15 * (uVar3 >> 0x1f);
        str2 = str2 + iVar14;
        uVar16 = uVar16 + 1;
        local_a0 = str2;
        local_98 = str1;
      }
    }
  }
  pSVar9 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
           operator->(this_03);
  pSVar9->block_idx = local_68;
  pSVar9->entry_idx = local_70;
  pSVar9 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
           operator->(this_02);
  pSVar9->block_idx = local_48;
  pSVar9->entry_idx = iStack_40;
  return;
}

Assistant:

void MergeSorter::ComputeMerge(const idx_t &count, bool left_smaller[]) {
	auto &l = *left;
	auto &r = *right;
	auto &l_sorted_block = *l.sb;
	auto &r_sorted_block = *r.sb;
	// Save indices to restore afterwards
	idx_t l_block_idx_before = l.block_idx;
	idx_t l_entry_idx_before = l.entry_idx;
	idx_t r_block_idx_before = r.block_idx;
	idx_t r_entry_idx_before = r.entry_idx;
	// Data pointers for both sides
	data_ptr_t l_radix_ptr;
	data_ptr_t r_radix_ptr;
	// Compute the merge of the next 'count' tuples
	idx_t compared = 0;
	while (compared < count) {
		// Move to the next block (if needed)
		if (l.block_idx < l_sorted_block.radix_sorting_data.size() &&
		    l.entry_idx == l_sorted_block.radix_sorting_data[l.block_idx]->count) {
			l.block_idx++;
			l.entry_idx = 0;
		}
		if (r.block_idx < r_sorted_block.radix_sorting_data.size() &&
		    r.entry_idx == r_sorted_block.radix_sorting_data[r.block_idx]->count) {
			r.block_idx++;
			r.entry_idx = 0;
		}
		const bool l_done = l.block_idx == l_sorted_block.radix_sorting_data.size();
		const bool r_done = r.block_idx == r_sorted_block.radix_sorting_data.size();
		if (l_done || r_done) {
			// One of the sides is exhausted, no need to compare
			break;
		}
		// Pin the radix sorting data
		left->PinRadix(l.block_idx);
		l_radix_ptr = left->RadixPtr();
		right->PinRadix(r.block_idx);
		r_radix_ptr = right->RadixPtr();

		const idx_t l_count = l_sorted_block.radix_sorting_data[l.block_idx]->count;
		const idx_t r_count = r_sorted_block.radix_sorting_data[r.block_idx]->count;
		// Compute the merge
		if (sort_layout.all_constant) {
			// All sorting columns are constant size
			for (; compared < count && l.entry_idx < l_count && r.entry_idx < r_count; compared++) {
				left_smaller[compared] = FastMemcmp(l_radix_ptr, r_radix_ptr, sort_layout.comparison_size) < 0;
				const bool &l_smaller = left_smaller[compared];
				const bool r_smaller = !l_smaller;
				// Use comparison bool (0 or 1) to increment entries and pointers
				l.entry_idx += l_smaller;
				r.entry_idx += r_smaller;
				l_radix_ptr += l_smaller * sort_layout.entry_size;
				r_radix_ptr += r_smaller * sort_layout.entry_size;
			}
		} else {
			// Pin the blob data
			left->PinData(*l_sorted_block.blob_sorting_data);
			right->PinData(*r_sorted_block.blob_sorting_data);
			// Merge with variable size sorting columns
			for (; compared < count && l.entry_idx < l_count && r.entry_idx < r_count; compared++) {
				left_smaller[compared] =
				    Comparators::CompareTuple(*left, *right, l_radix_ptr, r_radix_ptr, sort_layout, state.external) < 0;
				const bool &l_smaller = left_smaller[compared];
				const bool r_smaller = !l_smaller;
				// Use comparison bool (0 or 1) to increment entries and pointers
				l.entry_idx += l_smaller;
				r.entry_idx += r_smaller;
				l_radix_ptr += l_smaller * sort_layout.entry_size;
				r_radix_ptr += r_smaller * sort_layout.entry_size;
			}
		}
	}
	// Reset block indices
	left->SetIndices(l_block_idx_before, l_entry_idx_before);
	right->SetIndices(r_block_idx_before, r_entry_idx_before);
}